

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O3

Animation * rw::Animation::streamRead(Stream *stream)

{
  int32 iVar1;
  int32 flags;
  Animation *pAVar2;
  long lVar3;
  AnimInterpolatorInfo *interpInfo;
  float32 duration;
  
  iVar1 = Stream::readI32(stream);
  if (iVar1 == 0x100) {
    iVar1 = Stream::readI32(stream);
    lVar3 = 0;
    do {
      interpInfo = *(AnimInterpolatorInfo **)((long)&interpInfoList + lVar3);
      if ((interpInfo != (AnimInterpolatorInfo *)0x0) && (interpInfo->id == iVar1))
      goto LAB_00106284;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x50);
    interpInfo = (AnimInterpolatorInfo *)0x0;
LAB_00106284:
    iVar1 = Stream::readI32(stream);
    flags = Stream::readI32(stream);
    duration = Stream::readF32(stream);
    pAVar2 = create(interpInfo,iVar1,flags,(float)duration);
    (*interpInfo->streamRead)(stream,pAVar2);
  }
  else {
    pAVar2 = (Animation *)0x0;
  }
  return pAVar2;
}

Assistant:

Animation*
Animation::streamRead(Stream *stream)
{
	Animation *anim;
	if(stream->readI32() != 0x100)
		return nil;
	int32 typeID = stream->readI32();
	AnimInterpolatorInfo *interpInfo = AnimInterpolatorInfo::find(typeID);
	int32 numFrames = stream->readI32();
	int32 flags = stream->readI32();
	float duration = stream->readF32();
	anim = Animation::create(interpInfo, numFrames, flags, duration);
	interpInfo->streamRead(stream, anim);
	return anim;
}